

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O3

duk_ret_t dukglue::detail::
          FuncInfoHolder<Shape_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::FuncRuntime::call_native_function(duk_context *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *funcToCall;
  duk_idx_t in_ECX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  string local_40;
  
  duk_push_current_function(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_f507);
  funcToCall = (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *)duk_require_pointer(ctx,-1);
  if (funcToCall !=
      (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)0x0)
  {
    duk_pop_2(ctx);
    types::DukType<std::__cxx11::string>::read<std::__cxx11::string>
              (&local_40,(DukType<std::__cxx11::string> *)ctx,(duk_context *)0x0,in_ECX);
    paVar1 = &local_60.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      local_60.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl.field_2._8_8_ = local_40.field_2._8_8_;
      local_60.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_60.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = local_40._M_dataplus._M_p;
    }
    local_60.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    local_60.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = local_40._M_string_length;
    FuncInfoHolder<Shape*,std::__cxx11::string_const&>::FuncRuntime::
    actually_call<Shape*,std::__cxx11::string>(ctx,funcToCall,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_60.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    return 1;
  }
  duk_error_raw(ctx,-6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_function.h"
                ,0x41,"what even");
}

Assistant:

static duk_ret_t call_native_function(duk_context* ctx)
				{
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "func_ptr");
					void* fp_void = duk_require_pointer(ctx, -1);
					if (fp_void == NULL) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "what even");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

          static_assert(sizeof(RetType(*)(Ts...)) == sizeof(void*), "Function pointer and data pointer are different sizes");
					RetType(*funcToCall)(Ts...) = reinterpret_cast<RetType(*)(Ts...)>(fp_void);

					actually_call(ctx, funcToCall, dukglue::detail::get_stack_values<Ts...>(ctx));
					return std::is_void<RetType>::value ? 0 : 1;
				}